

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getInfoType(void *highs,char *info,HighsInt *type)

{
  HighsStatus HVar1;
  HighsInfoType t;
  allocator local_45;
  HighsInfoType local_44;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,info,&local_45);
  HVar1 = Highs::getInfoType((Highs *)highs,&local_40,&local_44);
  std::__cxx11::string::~string((string *)&local_40);
  *type = local_44;
  return HVar1;
}

Assistant:

HighsInt Highs_getInfoType(const void* highs, const char* info,
                           HighsInt* type) {
  HighsInfoType t;
  HighsInt retcode =
      (HighsInt)((Highs*)highs)->getInfoType(std::string(info), t);
  *type = (HighsInt)t;
  return retcode;
}